

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O0

void __thiscall Minisat::Solver::toDimacs(Solver *this,FILE *f,vec<Minisat::Lit,_int> *assumps)

{
  bool bVar1;
  Size SVar2;
  int iVar3;
  uint uVar4;
  Var_conflict VVar5;
  Size SVar6;
  Clause *this_00;
  Lit *pLVar7;
  uchar *tbs;
  vec<Minisat::Lit,_int> *in_RDX;
  size_t *siglen;
  FILE *in_RSI;
  uchar *sig;
  long in_RDI;
  size_t in_R8;
  int i_3;
  int i_2;
  int j;
  Clause *c;
  int i_1;
  int i;
  int cnt;
  Var_conflict max;
  vec<int,_int> map;
  undefined4 in_stack_fffffffffffffe88;
  CRef in_stack_fffffffffffffe8c;
  ClauseAllocator *in_stack_fffffffffffffe90;
  Solver *in_stack_fffffffffffffe98;
  Clause *in_stack_fffffffffffffea0;
  Solver *in_stack_fffffffffffffea8;
  Var_conflict *in_stack_fffffffffffffec0;
  vec<int,_int> *in_stack_fffffffffffffec8;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  FILE *in_stack_fffffffffffffed8;
  Solver *in_stack_fffffffffffffee0;
  Size local_74;
  uint local_68;
  int local_54;
  Size local_48;
  Size local_34;
  int local_30;
  vec<int,_int> local_28;
  vec<Minisat::Lit,_int> *local_18;
  FILE *local_10;
  
  if ((*(byte *)(in_RDI + 0x270) & 1) == 0) {
    fprintf(in_RSI,"p cnf 1 2\n1 0\n-1 0\n");
  }
  else {
    local_18 = in_RDX;
    local_10 = in_RSI;
    vec<int,_int>::vec(&local_28);
    local_30 = 0;
    for (local_34 = 0;
        SVar2 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)(in_RDI + 0x118)),
        local_34 < SVar2; local_34 = local_34 + 1) {
      vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)(in_RDI + 0x118),local_34);
      ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      bVar1 = satisfied(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      if (!bVar1) {
        local_30 = local_30 + 1;
      }
    }
    for (local_48 = 0;
        SVar2 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)(in_RDI + 0x118)),
        local_48 < SVar2; local_48 = local_48 + 1) {
      vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)(in_RDI + 0x118),local_48);
      ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      bVar1 = satisfied(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
      if (!bVar1) {
        vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)(in_RDI + 0x118),local_48);
        this_00 = ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
        for (local_54 = 0; iVar3 = Clause::size(this_00), local_54 < iVar3; local_54 = local_54 + 1)
        {
          Clause::operator[](this_00,local_54);
          value(in_stack_fffffffffffffe98,(Lit)(int)in_stack_fffffffffffffea0);
          bVar1 = lbool::operator!=((lbool *)CONCAT44(in_stack_fffffffffffffe8c,
                                                      in_stack_fffffffffffffe88),
                                    (lbool)(uint8_t)((ulong)in_stack_fffffffffffffe90 >> 0x38));
          if (bVar1) {
            pLVar7 = Clause::operator[](this_00,local_54);
            Minisat::var((Lit)pLVar7->x);
            mapVar((Var_conflict)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                   (vec<int,_int> *)in_stack_fffffffffffffe98,
                   (Var_conflict *)in_stack_fffffffffffffe90);
          }
        }
      }
    }
    SVar2 = vec<Minisat::Lit,_int>::size(local_18);
    fprintf(local_10,"p cnf %d %d\n",0,(ulong)(uint)(SVar2 + local_30));
    local_68 = 0;
    while( true ) {
      uVar4 = vec<Minisat::Lit,_int>::size(local_18);
      tbs = (uchar *)(ulong)uVar4;
      if ((int)uVar4 <= (int)local_68) break;
      sig = (uchar *)(ulong)local_68;
      in_stack_fffffffffffffed8 = local_10;
      in_stack_fffffffffffffee0 = (Solver *)vec<Minisat::Lit,_int>::operator[](local_18,local_68);
      uVar4 = Minisat::sign((EVP_PKEY_CTX *)(ulong)*(uint *)&in_stack_fffffffffffffee0->_vptr_Solver
                            ,sig,siglen,tbs,in_R8);
      in_stack_fffffffffffffed7 = (undefined1)uVar4;
      in_stack_fffffffffffffec0 = (Var_conflict *)0xf15e93;
      if ((uVar4 & 1) != 0) {
        in_stack_fffffffffffffec0 = (Var_conflict *)0xefdccc;
      }
      in_stack_fffffffffffffec8 =
           (vec<int,_int> *)vec<Minisat::Lit,_int>::operator[](local_18,local_68);
      Minisat::var((Lit)*(int *)&in_stack_fffffffffffffec8->data);
      VVar5 = mapVar((Var_conflict)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                     (vec<int,_int> *)in_stack_fffffffffffffe98,
                     (Var_conflict *)in_stack_fffffffffffffe90);
      fprintf(in_stack_fffffffffffffed8,"%s%d 0\n",in_stack_fffffffffffffec0,(ulong)(VVar5 + 1));
      local_68 = local_68 + 1;
    }
    for (local_74 = 0;
        SVar6 = vec<unsigned_int,_int>::size((vec<unsigned_int,_int> *)(in_RDI + 0x118)),
        local_74 < SVar6; local_74 = local_74 + 1) {
      vec<unsigned_int,_int>::operator[]((vec<unsigned_int,_int> *)(in_RDI + 0x118),local_74);
      in_stack_fffffffffffffe90 =
           (ClauseAllocator *)
           ClauseAllocator::operator[](in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
      toDimacs(in_stack_fffffffffffffee0,(FILE *)in_stack_fffffffffffffed8,
               (Clause *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0),
               in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
    }
    if (0 < *(int *)(in_RDI + 0x40)) {
      printf("Wrote DIMACS with %d variables and %d clauses.\n",0,(ulong)(uint)(SVar2 + local_30));
    }
    vec<int,_int>::~vec((vec<int,_int> *)0xa398bb);
  }
  return;
}

Assistant:

void Solver::toDimacs(FILE* f, const vec<Lit>& assumps)
{
    // Handle case when solver is in contradictory state:
    if (!ok){
        fprintf(f, "p cnf 1 2\n1 0\n-1 0\n");
        return; }

    vec<Var> map; Var max = 0;

    // Cannot use removeClauses here because it is not safe
    // to deallocate them at this point. Could be improved.
    int cnt = 0;
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]]))
            cnt++;
        
    for (int i = 0; i < clauses.size(); i++)
        if (!satisfied(ca[clauses[i]])){
            Clause& c = ca[clauses[i]];
            for (int j = 0; j < c.size(); j++)
                if (value(c[j]) != l_False)
                    mapVar(var(c[j]), map, max);
        }

    // Assumptions are added as unit clauses:
    cnt += assumps.size();

    fprintf(f, "p cnf %d %d\n", max, cnt);

    for (int i = 0; i < assumps.size(); i++){
        assert(value(assumps[i]) != l_False);
        fprintf(f, "%s%d 0\n", sign(assumps[i]) ? "-" : "", mapVar(var(assumps[i]), map, max)+1);
    }

    for (int i = 0; i < clauses.size(); i++)
        toDimacs(f, ca[clauses[i]], map, max);

    if (verbosity > 0)
        printf("Wrote DIMACS with %d variables and %d clauses.\n", max, cnt);
}